

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::LogUnusedDependency
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *result)

{
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  pointer pcVar1;
  size_type sVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  undefined1 auVar3 [16];
  bool bVar4;
  pointer prVar5;
  reference ppFVar6;
  char cVar7;
  string_view element_name;
  string_view element_name_00;
  anon_class_8_1_6f0ff714 make_error;
  FileDescriptor *unused;
  iterator __begin3;
  const_iterator itr;
  FileDescriptor **local_90;
  FileDescriptor *local_88;
  VoidPtr local_80;
  code *pcStack_78;
  VoidPtr local_70;
  code *pcStack_68;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  iterator local_50;
  iterator local_40;
  
  local_58 = local_60;
  this_00 = &this->unused_dependency_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  if (1 < (this->unused_dependency_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    local_40 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
               ::find<std::__cxx11::string>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                           *)&this->pool_->direct_input_files_,
                          (key_arg<std::__cxx11::basic_string<char>_> *)
                          ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc));
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)&this->pool_->direct_input_files_);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_58;
    _local_60 = (iterator)(auVar3 << 0x40);
    bVar4 = absl::lts_20250127::container_internal::operator==(&local_40,(iterator *)&local_60);
    if (bVar4) {
      cVar7 = '\0';
    }
    else {
      prVar5 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::iterator::operator->(&local_40);
      cVar7 = prVar5->second;
    }
    _local_60 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::begin(&this_00->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&this_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              );
    local_50.ctrl_ = (ctrl_t *)0x0;
    bVar4 = absl::lts_20250127::container_internal::operator==((iterator *)&local_60,&local_50);
    if (!bVar4) {
      do {
        ppFVar6 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::iterator::operator*((iterator *)&local_60);
        local_88 = *ppFVar6;
        local_90 = &local_88;
        pcVar1 = (local_88->name_->_M_dataplus)._M_p;
        sVar2 = local_88->name_->_M_string_length;
        if (cVar7 == '\0') {
          pcStack_78 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = &local_90;
          element_name_00._M_str = pcVar1;
          element_name_00._M_len = sVar2;
          local_80.obj = &local_90;
          AddWarning(this,element_name_00,&proto->super_Message,IMPORT,make_error_01);
        }
        else {
          pcStack_68 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::LogUnusedDependency(google::protobuf::FileDescriptorProto_const&,google::protobuf::FileDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = &local_90;
          element_name._M_str = pcVar1;
          element_name._M_len = sVar2;
          local_70.obj = &local_90;
          AddError(this,element_name,&proto->super_Message,IMPORT,make_error_00);
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::iterator::operator++((iterator *)&local_60);
        bVar4 = absl::lts_20250127::container_internal::operator==((iterator *)&local_60,&local_50);
      } while (!bVar4);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::LogUnusedDependency(const FileDescriptorProto& proto,
                                            const FileDescriptor* result) {
  (void)result;  // Parameter is used by Google-internal code.

  if (!unused_dependency_.empty()) {
    auto itr = pool_->direct_input_files_.find(proto.name());
    bool is_error = itr != pool_->direct_input_files_.end() && itr->second;
    for (const auto* unused : unused_dependency_) {
      auto make_error = [&] {
        return absl::StrCat("Import ", unused->name(), " is unused.");
      };
      if (is_error) {
        AddError(unused->name(), proto, DescriptorPool::ErrorCollector::IMPORT,
                 make_error);
      } else {
        AddWarning(unused->name(), proto,
                   DescriptorPool::ErrorCollector::IMPORT, make_error);
      }
    }
  }
}